

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown.cpp
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
(anonymous_namespace)::isCodeBlockLine_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,CTokenGroupIter *i,
          CTokenGroupIter end)

{
  undefined8 *puVar1;
  long *plVar2;
  CTokenGroupIter *pCVar3;
  long lVar4;
  undefined1 uVar5;
  char cVar6;
  long lVar7;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> r;
  type local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (*(long **)(*(long *)this + 0x10) != (long *)0x0) {
    cVar6 = (**(code **)(**(long **)(*(long *)this + 0x10) + 0x48))();
    if (cVar6 == '\0') {
      if (*(long **)(*(long *)this + 0x10) == (long *)0x0) goto LAB_00130e66;
      (**(code **)(**(long **)(*(long *)this + 0x10) + 0x38))(&local_70);
      if (local_70 != (type)0x0) {
        if (*(long **)(*(long *)this + 0x10) == (long *)0x0) goto LAB_00130e66;
        cVar6 = (**(code **)(**(long **)(*(long *)this + 0x10) + 0x40))();
        if (cVar6 != '\0') {
          if (*(long **)(*(long *)this + 0x10) == (long *)0x0) goto LAB_00130e66;
          (**(code **)(**(long **)(*(long *)this + 0x10) + 0x38))(&local_70);
          if (local_70 == (type)0x0) {
            __assert_fail("ptr_","/usr/include/boost/optional/detail/optional_reference_spec.hpp",
                          0x99,
                          "T &boost::optional<const std::basic_string<char> &>::operator*() const [T = const std::basic_string<char> &]"
                         );
          }
          if (3 < *(ulong *)((long)local_70 + 8)) {
            lVar4 = *(long *)local_70;
            lVar7 = 0;
            do {
              if (*(char *)(lVar4 + lVar7) != ' ') {
                if (lVar7 != 4) goto LAB_00130dd4;
                break;
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 != 4);
            *(undefined8 *)this = **(undefined8 **)this;
            lVar7 = *(long *)local_70;
            plVar2 = (long *)((long)local_70 + 8);
            local_70 = (type)&local_68._M_string_length;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)&local_70,lVar4 + 4,lVar7 + *plVar2);
            (__return_storage_ptr__->super_type).m_initialized = false;
            puVar1 = (undefined8 *)
                     ((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x10);
            *(undefined8 **)&(__return_storage_ptr__->super_type).m_storage.dummy_ = puVar1;
            if (local_70 == (type)&local_68._M_string_length) {
              *puVar1 = CONCAT71(local_68._M_string_length._1_7_,
                                 (undefined1)local_68._M_string_length);
              *(size_type *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x18) =
                   local_68.field_2._M_allocated_capacity;
            }
            else {
              (__return_storage_ptr__->super_type).m_storage.dummy_.aligner_ = local_70;
              *(ulong *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x10) =
                   CONCAT71(local_68._M_string_length._1_7_,(undefined1)local_68._M_string_length);
            }
            *(pointer *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 8) =
                 local_68._M_dataplus._M_p;
            (__return_storage_ptr__->super_type).m_initialized = true;
            return __return_storage_ptr__;
          }
        }
      }
    }
    else {
      pCVar3 = (CTokenGroupIter *)**(long **)this;
      *(CTokenGroupIter **)this = pCVar3;
      if (pCVar3 != i) {
        isCodeBlockLine_abi_cxx11_
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,this,i,end);
        uVar5 = local_70._0_1_;
        if (local_70._0_1_ == '\x01') {
          std::operator+(&local_48,"\n",&local_68);
          (__return_storage_ptr__->super_type).m_initialized = false;
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x10);
          *(undefined8 **)&(__return_storage_ptr__->super_type).m_storage.dummy_ = puVar1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p == &local_48.field_2) {
            *puVar1 = CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                               local_48.field_2._M_local_buf[0]);
            *(undefined8 *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x18) =
                 local_48.field_2._8_8_;
          }
          else {
            (__return_storage_ptr__->super_type).m_storage.dummy_.aligner_ =
                 (type)local_48._M_dataplus._M_p;
            *(ulong *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x10) =
                 CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                          local_48.field_2._M_local_buf[0]);
          }
          *(size_type *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 8) =
               local_48._M_string_length;
          local_48._M_string_length = 0;
          local_48.field_2._M_local_buf[0] = '\0';
          (__return_storage_ptr__->super_type).m_initialized = true;
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        }
        if ((local_70._0_1_ == '\x01') &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2)) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        if (uVar5 != '\0') {
          return __return_storage_ptr__;
        }
      }
      *(undefined8 *)this = *(undefined8 *)(*(long *)this + 8);
    }
LAB_00130dd4:
    (__return_storage_ptr__->super_type).m_initialized = false;
    return __return_storage_ptr__;
  }
LAB_00130e66:
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<markdown::Token>::operator->() const [T = markdown::Token]"
               );
}

Assistant:

optional<std::string> isCodeBlockLine(CTokenGroupIter& i, CTokenGroupIter end) {
	if ((*i)->isBlankLine()) {
		// If we get here, we're already in a code block.
		++i;
		if (i!=end) {
			optional<std::string> r=isCodeBlockLine(i, end);
			if (r) return std::string("\n"+*r);
		}
		--i;
	} else if ((*i)->text() && (*i)->canContainMarkup()) {
		const std::string& line(*(*i)->text());
		if (line.length()>=4) {
			std::string::const_iterator si=line.begin(), sie=si+4;
			while (si!=sie && *si==' ') ++si;
			if (si==sie) {
				++i;
				return std::string(si, line.end());
			}
		}
	}
	return none;
}